

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::operator==
          (Underwater_Acoustic_PDU *this,Underwater_Acoustic_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((((!KVar1) &&
         (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                            (&this->m_EmittingEntityID,&Value->m_EmittingEntityID), !KVar1)) &&
        (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar1
        )) && ((this->m_ui8StateUpdateIndicator == Value->m_ui8StateUpdateIndicator &&
               (this->m_ui16PassiveParamIndex == Value->m_ui16PassiveParamIndex)))) &&
      ((this->m_ui8PropPlantConfig == Value->m_ui8PropPlantConfig &&
       ((this->m_ui8NumShafts == Value->m_ui8NumShafts && (this->m_ui8NumAPA == Value->m_ui8NumAPA))
       )))) && ((this->m_ui8NumEmitterSys == Value->m_ui8NumEmitterSys &&
                ((bVar2 = std::operator!=(&this->m_vShafts,&Value->m_vShafts), !bVar2 &&
                 (bVar2 = std::operator!=(&this->m_vAPA,&Value->m_vAPA), !bVar2)))))) {
    bVar2 = std::operator!=(&this->m_vUAES,&Value->m_vUAES);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Underwater_Acoustic_PDU::operator == ( const Underwater_Acoustic_PDU & Value ) const
{
    if( Header::operator          !=( Value ) )                         return false;
    if( m_EmittingEntityID        != Value.m_EmittingEntityID )         return false;
    if( m_EventID                 != Value.m_EventID )                  return false;
    if( m_ui8StateUpdateIndicator != Value.m_ui8StateUpdateIndicator )  return false;
    if( m_ui16PassiveParamIndex   != Value.m_ui16PassiveParamIndex )    return false;
    if( m_ui8PropPlantConfig      != Value.m_ui8PropPlantConfig )       return false;
    if( m_ui8NumShafts            != Value.m_ui8NumShafts )             return false;
    if( m_ui8NumAPA               != Value.m_ui8NumAPA )                return false;
    if( m_ui8NumEmitterSys        != Value.m_ui8NumEmitterSys )         return false;
    if( m_vShafts                 != Value.m_vShafts )                  return false;
    if( m_vAPA                    != Value.m_vAPA )                     return false;
    if( m_vUAES                   != Value.m_vUAES )                   return false;
    return true;
}